

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O0

int nghttp2_submit_goaway
              (nghttp2_session *session,uint8_t flags,int32_t last_stream_id,uint32_t error_code,
              uint8_t *opaque_data,size_t opaque_data_len)

{
  uint8_t in_SIL;
  size_t in_RDI;
  uint32_t unaff_retaddr;
  int32_t unaff_retaddr_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if ((*(byte *)(in_RDI + 0xb75) & 1) == 0) {
    iVar1 = nghttp2_session_add_goaway
                      ((nghttp2_session *)opaque_data_len,unaff_retaddr_00,unaff_retaddr,
                       (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,in_SIL);
  }
  else {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int nghttp2_submit_goaway(nghttp2_session *session, uint8_t flags,
                          int32_t last_stream_id, uint32_t error_code,
                          const uint8_t *opaque_data, size_t opaque_data_len) {
  (void)flags;

  if (session->goaway_flags & NGHTTP2_GOAWAY_TERM_ON_SEND) {
    return 0;
  }
  return nghttp2_session_add_goaway(session, last_stream_id, error_code,
                                    opaque_data, opaque_data_len,
                                    NGHTTP2_GOAWAY_AUX_NONE);
}